

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::setupPassSwitch
          (FunctionalTest *this,bool shall_pass)

{
  int iVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000031;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar4 + 0xb48))(this->m_po_id,"shall_pass");
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetUniformLocation() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x21f);
  (**(code **)(lVar4 + 0x14f0))(uVar2,CONCAT71(in_register_00000031,shall_pass) & 0xffffffff);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glUniform1f() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x223);
  return;
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::setupPassSwitch(const bool shall_pass)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch where to set. */
	glw::GLuint location = gl.getUniformLocation(m_po_id, s_pass_switch_uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed.");

	/* Set. */
	gl.uniform1i(location, (int)shall_pass);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");
}